

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

void __thiscall Json::Value::Value(Value *this,Value *other)

{
  size_t sVar1;
  byte bVar2;
  ushort uVar3;
  _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *this_00;
  char *pcVar4;
  undefined8 *puVar5;
  long lVar6;
  
  bVar2 = (byte)*(ushort *)&other->field_0x8;
  uVar3 = (ushort)*(undefined4 *)&this->field_0x8 & 0xfe00 | *(ushort *)&other->field_0x8 & 0xff;
  *(ushort *)&this->field_0x8 = uVar3;
  this->comments_ = (CommentInfo *)0x0;
  sVar1 = other->limit_;
  this->start_ = other->start_;
  this->limit_ = sVar1;
  if (bVar2 < 8) {
    if ((0x2fU >> (bVar2 & 0x1f) & 1) == 0) {
      if ((0xc0U >> (bVar2 & 0x1f) & 1) == 0) {
        if ((other->value_).string_ == (char *)0x0) {
          (this->value_).int_ = 0;
          *(ushort *)&this->field_0x8 = uVar3;
        }
        else {
          pcVar4 = duplicateStringValue((other->value_).string_,0xffffffff);
          (this->value_).string_ = pcVar4;
          this->field_0x9 = this->field_0x9 | 1;
        }
      }
      else {
        this_00 = (_Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                   *)operator_new(0x30);
        std::
        _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
        ::_Rb_tree(this_00,&((other->value_).map_)->_M_t);
        (this->value_).map_ = (ObjectValues *)this_00;
      }
    }
    else {
      this->value_ = other->value_;
    }
    if (other->comments_ != (CommentInfo *)0x0) {
      puVar5 = (undefined8 *)operator_new__(0x20);
      *puVar5 = 3;
      puVar5[3] = 0;
      puVar5[1] = 0;
      puVar5[2] = 0;
      this->comments_ = (CommentInfo *)(puVar5 + 1);
      for (lVar6 = 0; lVar6 != 0x18; lVar6 = lVar6 + 8) {
        pcVar4 = *(char **)((long)&other->comments_->comment_ + lVar6);
        if (pcVar4 != (char *)0x0) {
          CommentInfo::setComment((CommentInfo *)((long)&this->comments_->comment_ + lVar6),pcVar4);
        }
      }
    }
    return;
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_value.cpp"
                ,0x16f,"Json::Value::Value(const Value &)");
}

Assistant:

Value::Value(const Value& other)
    : type_(other.type_), allocated_(false)
#ifdef JSON_VALUE_USE_INTERNAL_MAP
      ,
      itemIsUsed_(0)
#endif
      ,
      comments_(0), start_(other.start_), limit_(other.limit_) {
  switch (type_) {
  case nullValue:
  case intValue:
  case uintValue:
  case realValue:
  case booleanValue:
    value_ = other.value_;
    break;
  case stringValue:
    if (other.value_.string_) {
      value_.string_ = duplicateStringValue(other.value_.string_);
      allocated_ = true;
    } else {
      value_.string_ = 0;
      allocated_ = false;
    }
    break;
#ifndef JSON_VALUE_USE_INTERNAL_MAP
  case arrayValue:
  case objectValue:
    value_.map_ = new ObjectValues(*other.value_.map_);
    break;
#else
  case arrayValue:
    value_.array_ = arrayAllocator()->newArrayCopy(*other.value_.array_);
    break;
  case objectValue:
    value_.map_ = mapAllocator()->newMapCopy(*other.value_.map_);
    break;
#endif
  default:
    JSON_ASSERT_UNREACHABLE;
  }
  if (other.comments_) {
    comments_ = new CommentInfo[numberOfCommentPlacement];
    for (int comment = 0; comment < numberOfCommentPlacement; ++comment) {
      const CommentInfo& otherComment = other.comments_[comment];
      if (otherComment.comment_)
        comments_[comment].setComment(otherComment.comment_);
    }
  }
}